

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmprofilebinconv.cpp
# Opt level: O0

void fmprofilebinconv::doit(void)

{
  undefined1 local_68 [8];
  fm_profile f;
  size_t i;
  fm_profile_old q;
  
  f._32_8_ = fread(&i,0x30,1,_stdin);
  while (f._32_8_ != 0) {
    fm_profile::fm_profile((fm_profile *)local_68);
    local_68._0_4_ = (int)i;
    local_68._4_4_ = i._4_4_;
    switch(i._4_4_) {
    case 1:
    case 3:
      f.profile_id = q.allocrule_id;
      f.deductible3 = (OASIS_FLOAT)q.ccy_id;
      break;
    case 2:
      f.profile_id = q.allocrule_id;
      f.deductible3 = (OASIS_FLOAT)q.ccy_id;
      f.attachment = q.deductible;
      break;
    default:
      fprintf(_stderr,"Unknown calcrule_id %d\n",(ulong)i._4_4_);
      break;
    case 5:
      f.profile_id = (int)q.limits;
      f.deductible3 = q.share_prop_of_lim;
      break;
    case 9:
      f.profile_id = (int)q.deductible_prop_of_tiv;
      f.deductible3 = (OASIS_FLOAT)q.ccy_id;
      break;
    case 10:
      f.deductible1 = (OASIS_FLOAT)q.allocrule_id;
      break;
    case 0xb:
      f.calcrule_id = q.allocrule_id;
      break;
    case 0xc:
      f.profile_id = q.allocrule_id;
      break;
    case 0xe:
      f.deductible3 = (OASIS_FLOAT)q.ccy_id;
      break;
    case 0xf:
      f.deductible3 = q.share_prop_of_lim;
      break;
    case 0x10:
      f.profile_id = (int)q.limits;
    }
    f.deductible2 = 0.0;
    fwrite(local_68,0x28,1,_stdout);
    f._32_8_ = fread(&i,0x30,1,_stdin);
  }
  return;
}

Assistant:

void doit() {

        fm_profile_old q;
        size_t i = fread(&q, sizeof(q), 1, stdin);
        while (i != 0) {
            fm_profile f;
            f.profile_id = q.policytc_id;
            f.calcrule_id = q.calcrule_id;
            switch (f.calcrule_id) {
            case 1:
            case 3: {
                f.deductible1 = q.deductible;
                f.limit = q.limits;
            } break;
            case 2: {
                f.deductible1 = q.deductible;
                f.limit = q.limits;
                f.share1 = q.share_prop_of_lim;
            } break;
            case 5: {
                f.deductible1 = q.deductible_prop_of_loss;
                f.limit = q.limit_prop_of_loss;
            } break;
            case 9: {
                f.deductible1 = q.deductible_prop_of_limit;
                f.limit = q.limits;
            } break;
            case 10: {
                f.deductible3 = q.deductible;
            } break;
            case 11: {
                f.deductible2 = q.deductible;
            } break;
            case 12: {
                f.deductible1 = q.deductible;
            } break;
            case 14: {
                f.limit = q.limits;
            } break;
            case 15: {
                f.limit = q.limit_prop_of_loss;
            } break;
            case 16: {
                f.deductible1 = q.deductible_prop_of_loss;
            } break;
            default:
                fprintf(stderr, "Unknown calcrule_id %d\n", q.calcrule_id);
            }

            f.attachment = 0;

            fwrite(&f, sizeof(f), 1, stdout);
            i = fread(&q, sizeof(q), 1, stdin);
        }
    }